

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O0

char * __thiscall CEExceptionHandler::what(CEExceptionHandler *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  string local_e8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [40];
  
  std::__cxx11::string::clear();
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::operator+(in_stack_fffffffffffffef8,(char *)in_RDI);
  std::operator+(in_stack_fffffffffffffef8,in_RDI);
  std::operator+(in_stack_fffffffffffffef8,(char *)in_RDI);
  std::operator+(in_stack_fffffffffffffef8,in_RDI);
  std::operator+(in_stack_fffffffffffffef8,(char *)in_RDI);
  std::operator+(in_stack_fffffffffffffef8,in_RDI);
  std::operator+(in_stack_fffffffffffffef8,(char *)in_RDI);
  std::__cxx11::string::operator+=((string *)&in_RDI[4]._M_string_length,local_28);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

const char* CEExceptionHandler::what() const noexcept
{
    // Define the header of the error message
    full_msg_.clear();
    full_msg_ += "[ERROR] " + type_ + ": " + origin_ + "\n" + 
                      message_ + "\n" + backtrace_ + "\n";

    return full_msg_.c_str();
}